

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

void __thiscall Renderer::Render(Renderer *this,Snake *snake,SDL_Point *food)

{
  SDL_Renderer *pSVar1;
  SDL_Renderer *pSVar2;
  bool bVar3;
  undefined8 uVar4;
  reference pSVar5;
  SDL_Point *point;
  const_iterator __end1;
  const_iterator __begin1;
  vector<SDL_Point,_std::allocator<SDL_Point>_> *__range1;
  double degrees;
  SDL_Rect block;
  SDL_Point *food_local;
  Snake *snake_local;
  Renderer *this_local;
  
  block.x = (int)(this->screen_width / this->grid_width);
  block.y = (int)(this->screen_height / this->grid_height);
  block._8_8_ = food;
  SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0xff,0xff);
  SDL_RenderClear(this->sdl_renderer);
  degrees._0_4_ = *(int *)block._8_8_ * block.x;
  degrees._4_4_ = *(int *)(block._8_8_ + 4) * block.y;
  if ((Game::food_counter == 0) || (Game::food_counter % 4 != 0)) {
    if ((Game::food_counter == 0) || (Game::food_counter % 9 != 0)) {
      pSVar1 = this->sdl_renderer;
      pSVar2 = this->sdl_renderer;
      uVar4 = SDL_RWFromFile("../resources/cash.bmp","rb");
      uVar4 = SDL_LoadBMP_RW(uVar4,1);
      uVar4 = SDL_CreateTextureFromSurface(pSVar2,uVar4);
      SDL_RenderCopy(pSVar1,uVar4,0,&degrees);
    }
    else {
      pSVar1 = this->sdl_renderer;
      pSVar2 = this->sdl_renderer;
      uVar4 = SDL_RWFromFile("../resources/elikoptero.bmp","rb");
      uVar4 = SDL_LoadBMP_RW(uVar4,1);
      uVar4 = SDL_CreateTextureFromSurface(pSVar2,uVar4);
      SDL_RenderCopy(pSVar1,uVar4,0,&degrees);
    }
  }
  else {
    pSVar1 = this->sdl_renderer;
    pSVar2 = this->sdl_renderer;
    uVar4 = SDL_RWFromFile("../resources/kotero.bmp","rb");
    uVar4 = SDL_LoadBMP_RW(uVar4,1);
    uVar4 = SDL_CreateTextureFromSurface(pSVar2,uVar4);
    SDL_RenderCopy(pSVar1,uVar4,0,&degrees);
  }
  SDL_SetRenderDrawColor(this->sdl_renderer,0xea,0xaa,0,0xff);
  __end1 = std::vector<SDL_Point,_std::allocator<SDL_Point>_>::begin(&snake->body);
  point = (SDL_Point *)std::vector<SDL_Point,_std::allocator<SDL_Point>_>::end(&snake->body);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>
                                     *)&point), bVar3) {
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>
             ::operator*(&__end1);
    degrees._0_4_ = pSVar5->x * block.x;
    degrees._4_4_ = pSVar5->y * block.y;
    SDL_RenderFillRect(this->sdl_renderer,&degrees);
    __gnu_cxx::
    __normal_iterator<const_SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>::
    operator++(&__end1);
  }
  degrees._0_4_ = (int)snake->head_x * block.x;
  degrees._4_4_ = (int)snake->head_y * block.y;
  if ((snake->alive & 1U) == 0) {
    SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0);
    SDL_RenderFillRect(this->sdl_renderer,&degrees);
  }
  else {
    switch(snake->direction) {
    case kUp:
      pSVar1 = this->sdl_renderer;
      pSVar2 = this->sdl_renderer;
      uVar4 = SDL_RWFromFile("../resources/madclip-top.bmp","rb");
      uVar4 = SDL_LoadBMP_RW(uVar4,1);
      uVar4 = SDL_CreateTextureFromSurface(pSVar2,uVar4);
      SDL_RenderCopy(pSVar1,uVar4,0,&degrees);
      break;
    case kDown:
      pSVar1 = this->sdl_renderer;
      pSVar2 = this->sdl_renderer;
      uVar4 = SDL_RWFromFile("../resources/madclip-down.bmp","rb");
      uVar4 = SDL_LoadBMP_RW(uVar4,1);
      uVar4 = SDL_CreateTextureFromSurface(pSVar2,uVar4);
      SDL_RenderCopy(pSVar1,uVar4,0,&degrees);
      break;
    case kLeft:
      pSVar1 = this->sdl_renderer;
      pSVar2 = this->sdl_renderer;
      uVar4 = SDL_RWFromFile("../resources/madclip-left.bmp","rb");
      uVar4 = SDL_LoadBMP_RW(uVar4,1);
      uVar4 = SDL_CreateTextureFromSurface(pSVar2,uVar4);
      SDL_RenderCopy(pSVar1,uVar4,0,&degrees);
      break;
    case kRight:
      pSVar1 = this->sdl_renderer;
      pSVar2 = this->sdl_renderer;
      uVar4 = SDL_RWFromFile("../resources/madclip-right.bmp","rb");
      uVar4 = SDL_LoadBMP_RW(uVar4,1);
      uVar4 = SDL_CreateTextureFromSurface(pSVar2,uVar4);
      SDL_RenderCopy(pSVar1,uVar4,0,&degrees);
    }
  }
  SDL_RenderPresent(this->sdl_renderer);
  return;
}

Assistant:

void Renderer::Render(Snake const snake, SDL_Point const &food) {
  SDL_Rect block;
  double degrees;
  block.w = screen_width / (grid_width);
  block.h = screen_height / (grid_height);

  // Clear screen
  SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0xFF, 0xFF, 0xFF);
  SDL_RenderClear(sdl_renderer);

  // Render food
  block.x = food.x * block.w;
  block.y = food.y * block.h;


  //rendering special food
  if(Game::food_counter !=0 && Game::food_counter%4 == 0){
    SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/kotero.bmp")), NULL, &block);
  }
  else if (Game::food_counter !=0 && Game::food_counter%9 == 0)
  {
    SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/elikoptero.bmp")), NULL, &block);
  }
  else
  {
    SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/cash.bmp")), NULL, &block);
  } 

  // Render snake's body
  SDL_SetRenderDrawColor(sdl_renderer, 234, 170, 0, 255);
  for (SDL_Point const &point : snake.body) {
    block.x = point.x * block.w;
    block.y = point.y * block.h;
    SDL_RenderFillRect(sdl_renderer, &block);
  }

  // Render snake's head
  block.x = static_cast<int>(snake.head_x) * block.w;
  block.y = static_cast<int>(snake.head_y) * block.h;

  if (snake.alive) {

      
    switch (snake.direction) 
    {
      case Snake::Direction::kUp:
        SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/madclip-top.bmp")), NULL, &block);
        break;
      case Snake::Direction::kRight:
        SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/madclip-right.bmp")), NULL, &block);
        break;
      case Snake::Direction::kDown:
        SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/madclip-down.bmp")), NULL, &block);
        break;
      case Snake::Direction::kLeft:
        SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/madclip-left.bmp")), NULL, &block);
        break;
    }
    
  } else {
    SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0x00, 0x00, 0xFF);
    SDL_RenderFillRect(sdl_renderer, &block);
  }


  // Update Screen
  SDL_RenderPresent(sdl_renderer);
}